

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O1

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this)

{
  ValueHashTableBucketElem<unsigned_int> *pVVar1;
  ValueHashTableBucketElem<unsigned_int> *pVVar2;
  ulong uVar3;
  
  if (this->fHashModulus != 0) {
    uVar3 = 0;
    do {
      pVVar2 = this->fBucketList[uVar3];
      while (pVVar2 != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
        pVVar1 = pVVar2->fNext;
        operator_delete(pVVar2,0x18);
        pVVar2 = pVVar1;
      }
      this->fBucketList[uVar3] = (ValueHashTableBucketElem<unsigned_int> *)0x0;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->fHashModulus);
  }
  return;
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::removeAll()
{
    // Clean up the buckets first
    for (XMLSize_t buckInd = 0; buckInd < fHashModulus; buckInd++)
    {
        // Get the bucket list head for this entry
        ValueHashTableBucketElem<TVal>* curElem = fBucketList[buckInd];
        ValueHashTableBucketElem<TVal>* nextElem;
        while (curElem)
        {
            // Save the next element before we hose this one
            nextElem = curElem->fNext;

            // delete the current element and move forward
            delete curElem;
            curElem = nextElem;
        }

        // Clean out this entry
        fBucketList[buckInd] = 0;
    }
}